

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall
ClipperLib::ClipperOffset::OffsetPoint(ClipperOffset *this,int j,int *k,JoinType jointype)

{
  pointer *ppIVar1;
  Path *this_00;
  double dVar2;
  int k_00;
  pointer pDVar3;
  pointer pIVar4;
  double dVar5;
  double dVar6;
  cInt cVar7;
  double dVar8;
  IntPoint *__args;
  iterator iVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  IntPoint local_38;
  
  k_00 = *k;
  pDVar3 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar12 = pDVar3[j].X;
  dVar13 = pDVar3[j].Y;
  dVar5 = pDVar3[k_00].X;
  dVar6 = pDVar3[k_00].Y;
  dVar14 = dVar5 * dVar13 - dVar6 * dVar12;
  this->m_sinA = dVar14;
  dVar2 = this->m_delta;
  if (1.0 <= ABS(dVar14 * dVar2)) {
    dVar8 = 1.0;
    if ((1.0 < dVar14) || (dVar8 = -1.0, dVar14 < -1.0)) {
      dVar14 = dVar8;
      this->m_sinA = dVar14;
    }
  }
  else if (0.0 < dVar5 * dVar12 + dVar13 * dVar6) {
    pIVar4 = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start;
    dVar12 = dVar5 * dVar2 + (double)pIVar4[j].X;
    dVar13 = dVar6 * dVar2 + (double)pIVar4[j].Y;
    uVar10 = -(ulong)(dVar12 < 0.0);
    uVar11 = -(ulong)(dVar13 < 0.0);
    local_38.X = (cInt)((double)(uVar10 & 0xbfe0000000000000 | ~uVar10 & 0x3fe0000000000000) +
                       dVar12);
    local_38.Y = (cInt)((double)(uVar11 & 0xbfe0000000000000 | ~uVar11 & 0x3fe0000000000000) +
                       dVar13);
    iVar9._M_current =
         (this->m_destPoly).
         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar9._M_current !=
        (this->m_destPoly).
        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      (iVar9._M_current)->X = local_38.X;
      (iVar9._M_current)->Y = local_38.Y;
      ppIVar1 = &(this->m_destPoly).
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppIVar1 = *ppIVar1 + 1;
      return;
    }
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    _M_realloc_insert<ClipperLib::IntPoint>(&this->m_destPoly,iVar9,&local_38);
    return;
  }
  if (dVar14 * dVar2 < 0.0) {
    this_00 = &this->m_destPoly;
    pIVar4 = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start;
    dVar12 = dVar5 * dVar2 + (double)pIVar4[j].X;
    dVar13 = dVar6 * dVar2 + (double)pIVar4[j].Y;
    uVar10 = -(ulong)(dVar12 < 0.0);
    uVar11 = -(ulong)(dVar13 < 0.0);
    local_38.X = (cInt)((double)(uVar10 & 0xbfe0000000000000 | ~uVar10 & 0x3fe0000000000000) +
                       dVar12);
    local_38.Y = (cInt)((double)(uVar11 & 0xbfe0000000000000 | ~uVar11 & 0x3fe0000000000000) +
                       dVar13);
    iVar9._M_current =
         (this->m_destPoly).
         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (this->m_destPoly).
        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
      _M_realloc_insert<ClipperLib::IntPoint>(this_00,iVar9,&local_38);
      iVar9._M_current =
           (this->m_destPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar9._M_current)->X = local_38.X;
      (iVar9._M_current)->Y = local_38.Y;
      iVar9._M_current =
           (this->m_destPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->m_destPoly).
      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar9._M_current;
    }
    __args = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start + j;
    if (iVar9._M_current ==
        (this->m_destPoly).
        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
      _M_realloc_insert<ClipperLib::IntPoint_const&>
                ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)this_00,iVar9,
                 __args);
      iVar9._M_current =
           (this->m_destPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      cVar7 = __args->Y;
      (iVar9._M_current)->X = __args->X;
      (iVar9._M_current)->Y = cVar7;
      iVar9._M_current =
           (this->m_destPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (this->m_destPoly).
      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar9._M_current;
    }
    pIVar4 = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start;
    pDVar3 = (this->m_normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start + j;
    dVar12 = this->m_delta * pDVar3->X + (double)pIVar4[j].X;
    dVar13 = this->m_delta * pDVar3->Y + (double)pIVar4[j].Y;
    uVar10 = -(ulong)(dVar12 < 0.0);
    uVar11 = -(ulong)(dVar13 < 0.0);
    local_38.X = (cInt)((double)(uVar10 & 0xbfe0000000000000 | ~uVar10 & 0x3fe0000000000000) +
                       dVar12);
    local_38.Y = (cInt)((double)(uVar11 & 0xbfe0000000000000 | ~uVar11 & 0x3fe0000000000000) +
                       dVar13);
    if (iVar9._M_current ==
        (this->m_destPoly).
        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
      _M_realloc_insert<ClipperLib::IntPoint>(this_00,iVar9,&local_38);
    }
    else {
      (iVar9._M_current)->X = local_38.X;
      (iVar9._M_current)->Y = local_38.Y;
      ppIVar1 = &(this->m_destPoly).
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppIVar1 = *ppIVar1 + 1;
    }
    goto LAB_00115aef;
  }
  if (jointype != jtSquare) {
    if (jointype == jtRound) {
      DoRound(this,j,k_00);
      goto LAB_00115aef;
    }
    if (jointype != jtMiter) goto LAB_00115aef;
    dVar12 = dVar12 * dVar5 + dVar13 * dVar6 + 1.0;
    if (this->m_miterLim <= dVar12) {
      DoMiter(this,j,k_00,dVar12);
      goto LAB_00115aef;
    }
  }
  DoSquare(this,j,k_00);
LAB_00115aef:
  *k = j;
  return;
}

Assistant:

void ClipperOffset::OffsetPoint(int j, int& k, JoinType jointype)
{
  //cross product ...
  m_sinA = (m_normals[k].X * m_normals[j].Y - m_normals[j].X * m_normals[k].Y);
  if (std::fabs(m_sinA * m_delta) < 1.0) 
  {
    //dot product ...
    double cosA = (m_normals[k].X * m_normals[j].X + m_normals[j].Y * m_normals[k].Y ); 
    if (cosA > 0) // angle => 0 degrees
    {
      m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[k].X * m_delta),
        Round(m_srcPoly[j].Y + m_normals[k].Y * m_delta)));
      return; 
    }
    //else angle => 180 degrees   
  }
  else if (m_sinA > 1.0) m_sinA = 1.0;
  else if (m_sinA < -1.0) m_sinA = -1.0;

  if (m_sinA * m_delta < 0)
  {
    m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[k].X * m_delta),
      Round(m_srcPoly[j].Y + m_normals[k].Y * m_delta)));
    m_destPoly.push_back(m_srcPoly[j]);
    m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[j].X * m_delta),
      Round(m_srcPoly[j].Y + m_normals[j].Y * m_delta)));
  }
  else
    switch (jointype)
    {
      case jtMiter:
        {
          double r = 1 + (m_normals[j].X * m_normals[k].X +
            m_normals[j].Y * m_normals[k].Y);
          if (r >= m_miterLim) DoMiter(j, k, r); else DoSquare(j, k);
          break;
        }
      case jtSquare: DoSquare(j, k); break;
      case jtRound: DoRound(j, k); break;
    }
  k = j;
}